

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

bool __thiscall OpenMD::SimInfo::addMolecule(SimInfo *this,Molecule *mol)

{
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  pointer ppBVar3;
  pointer ppBVar4;
  pointer ppTVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppCVar8;
  pointer ppSVar9;
  pointer ppRVar10;
  pointer ppCVar11;
  pointer ppSVar12;
  pointer ppRVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  pair<int,_OpenMD::Molecule_*> local_30;
  
  local_30.first = mol->globalIndex_;
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  p_Var15 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var14 = &p_Var1->_M_header;
  for (; p_Var15 != (_Base_ptr)0x0;
      p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < local_30.first]) {
    if (local_30.first <= (int)p_Var15[1]._M_color) {
      p_Var14 = p_Var15;
    }
  }
  p_Var15 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
     (p_Var15 = p_Var14, local_30.first < (int)p_Var14[1]._M_color)) {
    p_Var15 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var15 == p_Var1) {
    local_30.second = mol;
    std::
    _Rb_tree<int,std::pair<int_const,OpenMD::Molecule*>,std::_Select1st<std::pair<int_const,OpenMD::Molecule*>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::Molecule*>>>
    ::_M_emplace_unique<std::pair<int,OpenMD::Molecule*>>
              ((_Rb_tree<int,std::pair<int_const,OpenMD::Molecule*>,std::_Select1st<std::pair<int_const,OpenMD::Molecule*>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::Molecule*>>>
                *)&this->molecules_,&local_30);
    ppTVar2 = (mol->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppBVar3 = (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppBVar4 = (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppTVar5 = (mol->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar6 = (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppBVar7 = (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    this->nAtoms_ =
         this->nAtoms_ +
         (int)((ulong)((long)(mol->atoms_).
                             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(mol->atoms_).
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
    this->nBonds_ = this->nBonds_ + (int)((ulong)((long)ppBVar4 - (long)ppBVar7) >> 3);
    this->nBends_ = this->nBends_ + (int)((ulong)((long)ppBVar3 - (long)ppBVar6) >> 3);
    this->nTorsions_ = this->nTorsions_ + (int)((ulong)((long)ppTVar2 - (long)ppTVar5) >> 3);
    ppCVar8 = (mol->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppSVar9 = (mol->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppRVar10 = (mol->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    ppCVar11 = (mol->cutoffGroups_).
               super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar12 = (mol->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppRVar13 = (mol->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    this->nInversions_ =
         (int)((ulong)((long)(mol->inversions_).
                             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(mol->inversions_).
                            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + this->nInversions_;
    this->nRigidBodies_ = (int)((ulong)((long)ppRVar10 - (long)ppRVar13) >> 3) + this->nRigidBodies_
    ;
    this->nIntegrableObjects_ =
         (int)((ulong)((long)ppSVar9 - (long)ppSVar12) >> 3) + this->nIntegrableObjects_;
    this->nCutoffGroups_ =
         (int)((ulong)((long)ppCVar8 - (long)ppCVar11) >> 3) + this->nCutoffGroups_;
    this->nConstraints_ =
         this->nConstraints_ +
         (int)((ulong)((long)(mol->constraintPairs_).
                             super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(mol->constraintPairs_).
                            super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    addInteractionPairs(this,mol);
  }
  return (_Rb_tree_header *)p_Var15 == p_Var1;
}

Assistant:

bool SimInfo::addMolecule(Molecule* mol) {
    MoleculeIterator i;

    i = molecules_.find(mol->getGlobalIndex());
    if (i == molecules_.end()) {
      molecules_.insert(make_pair(mol->getGlobalIndex(), mol));

      nAtoms_ += mol->getNAtoms();
      nBonds_ += mol->getNBonds();
      nBends_ += mol->getNBends();
      nTorsions_ += mol->getNTorsions();
      nInversions_ += mol->getNInversions();
      nRigidBodies_ += mol->getNRigidBodies();
      nIntegrableObjects_ += mol->getNIntegrableObjects();
      nCutoffGroups_ += mol->getNCutoffGroups();
      nConstraints_ += mol->getNConstraintPairs();

      addInteractionPairs(mol);

      return true;
    } else {
      return false;
    }
  }